

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

qint64 __thiscall QDateTime::daysTo(QDateTime *this,QDateTime *other)

{
  long lVar1;
  QDate this_00;
  qint64 qVar2;
  QDate in_RDI;
  long in_FS_OFFSET;
  QDateTime *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  date(in_stack_ffffffffffffffd8);
  this_00 = date(in_stack_ffffffffffffffd8);
  qVar2 = QDate::daysTo(this_00.jd,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QDateTime::daysTo(const QDateTime &other) const
{
    return date().daysTo(other.date());
}